

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

int __thiscall ncnn::ParamDict::load_param(ParamDict *this,uchar **mem)

{
  int iVar1;
  int iVar2;
  long *in_RSI;
  long in_RDI;
  Mat *unaff_retaddr;
  int len;
  bool is_array;
  int id;
  ParamDict *in_stack_00000030;
  undefined4 in_stack_ffffffffffffffe8;
  long lVar3;
  
  lVar3 = in_RDI;
  clear(in_stack_00000030);
  iVar2 = *(int *)*in_RSI;
  *in_RSI = *in_RSI + 4;
  while (iVar2 != -0xe9) {
    in_stack_ffffffffffffffe8 = CONCAT13(iVar2 < -0x5b03,(int3)in_stack_ffffffffffffffe8);
    if (iVar2 < -0x5b03) {
      iVar2 = -0x5b04 - iVar2;
      iVar1 = *(int *)*in_RSI;
      *in_RSI = *in_RSI + 4;
      Mat::create(unaff_retaddr,(int)((ulong)lVar3 >> 0x20),(size_t)in_RSI,
                  (Allocator *)CONCAT44(iVar2,in_stack_ffffffffffffffe8));
      memcpy(*(void **)(in_RDI + (long)iVar2 * 0x40 + 0x18),(void *)*in_RSI,(long)(iVar1 << 2));
      *in_RSI = *in_RSI + (long)(iVar1 << 2);
    }
    else {
      *(undefined4 *)(in_RDI + (long)iVar2 * 0x40 + 0x14) = *(undefined4 *)*in_RSI;
      *in_RSI = *in_RSI + 4;
    }
    *(undefined4 *)(in_RDI + 0x10 + (long)iVar2 * 0x40) = 1;
    iVar2 = *(int *)*in_RSI;
    *in_RSI = *in_RSI + 4;
  }
  return 0;
}

Assistant:

int ParamDict::load_param(const unsigned char*& mem)
{
    clear();

    int id = *(int*)(mem);
    mem += 4;

    while (id != -233)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (is_array)
        {
            int len = *(int*)(mem);
            mem += 4;

            params[id].v.create(len);

            memcpy(params[id].v.data, mem, len * 4);
            mem += len * 4;
        }
        else
        {
            params[id].f = *(float*)(mem);
            mem += 4;
        }

        params[id].loaded = 1;

        id = *(int*)(mem);
        mem += 4;
    }

    return 0;
}